

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void draw_width(int x,int y,int r,Fl_Align a)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  int local_34;
  int ly;
  int lw;
  int w;
  char buf [16];
  Fl_Align a_local;
  int r_local;
  int y_local;
  int x_local;
  
  uVar1 = r - x;
  buf._8_4_ = a;
  buf._12_4_ = r;
  sprintf((char *)&lw,"%d",(ulong)uVar1);
  fl_font(0,9);
  dVar3 = fl_width((char *)&lw);
  iVar2 = (int)dVar3;
  local_34 = y + 4;
  buf._12_4_ = buf._12_4_ + -1;
  if ((int)(uVar1 - 0x14) < iVar2) {
    if (buf._8_4_ == 1) {
      local_34 = y + -6;
    }
    else {
      local_34 = y + 0xe;
    }
    fl_xyline(x,y,buf._12_4_);
  }
  else {
    fl_xyline(x,y,x + (int)((uVar1 - iVar2) + -2) / 2);
    fl_xyline(x + (int)(uVar1 + iVar2 + 2) / 2,y,buf._12_4_);
  }
  fl_draw((char *)&lw,x + (int)(uVar1 - iVar2) / 2,local_34);
  fl_line(x + 5,y + -2,x + 1,y,x + 5,y + 2);
  fl_line(buf._12_4_ + -5,y + -2,buf._12_4_ + -1,y,buf._12_4_ + -5,y + 2);
  fl_yxline(x,y + -4,y + 4);
  fl_yxline(buf._12_4_,y + -4,y + 4);
  return;
}

Assistant:

static void draw_width(int x, int y, int r, Fl_Align a) {
  char buf[16];
  int w = r-x;
  sprintf(buf, "%d", w);
  fl_font(FL_HELVETICA, 9);
  int lw = (int)fl_width(buf);
  int ly = y + 4;

  r --;

  if (lw > (w - 20)) {
    // Move width above/below the arrows...
    if (a == FL_ALIGN_TOP) ly -= 10;
    else ly += 10;

    fl_xyline(x, y, r);
  } else {
    // Put width inside the arrows...
    fl_xyline(x, y, x + (w - lw - 2) / 2);
    fl_xyline(x + (w + lw + 2) / 2, y, r);
  }

  // Draw the width...
  fl_draw(buf, x + (w - lw) / 2, ly);

  // Draw the arrowheads...
  fl_line(x+5, y-2, x+1, y, x+5, y+2);
  fl_line(r-5, y-2, r-1, y, r-5, y+2);

  // Draw the end lines...
  fl_yxline(x, y - 4, y + 4);
  fl_yxline(r, y - 4, y + 4);
}